

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void * TableSettingsHandler_ReadOpen(ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  int iVar1;
  ImGuiTableSettings *pIVar2;
  ImGuiID id;
  int columns_count;
  
  pIVar2 = (ImGuiTableSettings *)0x0;
  iVar1 = __isoc99_sscanf(name,"0x%08X,%d");
  if (1 < iVar1) {
    pIVar2 = ImGui::TableSettingsFindByID(0);
    if (pIVar2 != (ImGuiTableSettings *)0x0) {
      if (-1 < pIVar2->ColumnsCountMax) {
        InitTableSettings(pIVar2,0,0,(int)pIVar2->ColumnsCountMax);
        return pIVar2;
      }
      pIVar2->ID = 0;
    }
    pIVar2 = ImGui::TableSettingsCreate(0,0);
  }
  return pIVar2;
}

Assistant:

static void* TableSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiID id = 0;
    int columns_count = 0;
    if (sscanf(name, "0x%08X,%d", &id, &columns_count) < 2)
        return NULL;

    if (ImGuiTableSettings* settings = ImGui::TableSettingsFindByID(id))
    {
        if (settings->ColumnsCountMax >= columns_count)
        {
            InitTableSettings(settings, id, columns_count, settings->ColumnsCountMax); // Recycle
            return settings;
        }
        settings->ID = 0; // Invalidate storage if we won't fit because of a count change
    }
    return ImGui::TableSettingsCreate(id, columns_count);
}